

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginDragDropTargetCustom(ImRect *bb,ImGuiID id)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_00000010;
  bool local_1;
  
  pIVar2 = GImGui;
  if ((GImGui->DragDropActive & 1U) == 0) {
    local_1 = false;
  }
  else {
    pIVar1 = GImGui->CurrentWindow;
    if ((GImGui->HoveredWindow == (ImGuiWindow *)0x0) ||
       (pIVar1->RootWindow != GImGui->HoveredWindow->RootWindow)) {
      local_1 = false;
    }
    else {
      if (in_ESI == 0) {
        __assert_fail("id != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                      ,0x246f,"bool ImGui::BeginDragDropTargetCustom(const ImRect &, ImGuiID)");
      }
      bVar3 = IsMouseHoveringRect(&bb->Min,(ImVec2 *)CONCAT44(id,in_stack_00000010),g._7_1_);
      if ((bVar3) && (in_ESI != (pIVar2->DragDropPayload).SourceId)) {
        if ((pIVar1->SkipItems & 1U) == 0) {
          if ((pIVar2->DragDropWithinTarget & 1U) != 0) {
            __assert_fail("g.DragDropWithinTarget == false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                          ,0x2475,"bool ImGui::BeginDragDropTargetCustom(const ImRect &, ImGuiID)");
          }
          (pIVar2->DragDropTargetRect).Min = *in_RDI;
          (pIVar2->DragDropTargetRect).Max = in_RDI[1];
          pIVar2->DragDropTargetId = in_ESI;
          pIVar2->DragDropWithinTarget = true;
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool ImGui::BeginDragDropTargetCustom(const ImRect& bb, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    if (!g.DragDropActive)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (g.HoveredWindow == NULL || window->RootWindow != g.HoveredWindow->RootWindow)
        return false;
    IM_ASSERT(id != 0);
    if (!IsMouseHoveringRect(bb.Min, bb.Max) || (id == g.DragDropPayload.SourceId))
        return false;
    if (window->SkipItems)
        return false;

    IM_ASSERT(g.DragDropWithinTarget == false);
    g.DragDropTargetRect = bb;
    g.DragDropTargetId = id;
    g.DragDropWithinTarget = true;
    return true;
}